

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

int fits_read_ascii_region(char *filename,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  RgnShape *newShape;
  char cVar1;
  shapeType sVar2;
  ushort *puVar3;
  undefined4 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  SAORegion *aRgn;
  byte *__s;
  FILE *__stream;
  char *pcVar8;
  size_t sVar9;
  byte *pbVar10;
  size_t sVar11;
  ushort **ppuVar12;
  RgnShape *pRVar13;
  anon_union_120_2_131c4ffb_for_param *paVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  WCSdata *pWVar18;
  WCSdata *pWVar19;
  byte *pbVar20;
  uint uVar21;
  byte *pbVar22;
  byte *pbVar23;
  size_t __size;
  byte *pbVar24;
  bool bVar25;
  byte bVar26;
  double dVar27;
  double dVar28;
  double ypos;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  char *endp;
  double y;
  double x;
  uint local_d4;
  ulong local_d0;
  double local_a0;
  anon_union_120_2_131c4ffb_for_param *local_98;
  char *local_88;
  ushort **local_80;
  double local_78;
  double local_70;
  WCSdata *local_68;
  char *local_60;
  double local_58;
  double local_50;
  byte *local_48;
  char *local_40;
  SAORegion **local_38;
  
  bVar26 = 0;
  if (*status != 0) {
    return *status;
  }
  aRgn = (SAORegion *)malloc(0x58);
  if (aRgn == (SAORegion *)0x0) {
LAB_001b1df5:
    ffpmsg("Couldn\'t allocate memory to hold Region file contents.");
    *status = 0x71;
    return 0x71;
  }
  aRgn->nShapes = 0;
  aRgn->Shapes = (RgnShape *)0x0;
  if ((wcs == (WCSdata *)0x0) || (wcs->exists == 0)) {
    (aRgn->wcs).exists = 0;
  }
  else {
    pWVar18 = wcs;
    pWVar19 = &aRgn->wcs;
    for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
      uVar4 = *(undefined4 *)&pWVar18->field_0x4;
      pWVar19->exists = pWVar18->exists;
      *(undefined4 *)&pWVar19->field_0x4 = uVar4;
      pWVar18 = (WCSdata *)((long)pWVar18 + (ulong)bVar26 * -0x10 + 8);
      pWVar19 = (WCSdata *)((long)pWVar19 + (ulong)bVar26 * -0x10 + 8);
    }
  }
  __s = (byte *)malloc(0x200);
  if (__s == (byte *)0x0) {
    free(aRgn);
    goto LAB_001b1df5;
  }
  local_68 = wcs;
  __stream = fopen64(filename,"r");
  if (__stream == (FILE *)0x0) {
    snprintf((char *)__s,0x200,"Could not open Region file %s.",filename);
    ffpmsg((char *)__s);
    free(__s);
    free(aRgn);
    *status = 0x68;
    return 0x68;
  }
  *status = 0x68;
  local_38 = Rgn;
  pcVar8 = fgets((char *)__s,0x200,__stream);
  if (pcVar8 != (char *)0x0) {
    local_40 = local_68->type;
    iVar6 = 0;
    local_70 = 0.0;
    local_78 = 0.0;
    local_60 = "Galactic region coordinates not supported";
    sVar11 = 0x200;
    do {
      *status = 0;
      sVar9 = strlen((char *)__s);
      __size = sVar11;
      if (sVar9 == sVar11 - 1) {
        do {
          __size = sVar11;
          if (__s[sVar9 - 1] == 10) break;
          __size = sVar11 * 2;
          pbVar10 = (byte *)realloc(__s,__size);
          if (pbVar10 == (byte *)0x0) {
            pcVar8 = "Couldn\'t allocate memory to hold Region file contents.";
            goto LAB_001b1e5f;
          }
          fgets((char *)(pbVar10 + sVar9),(int)sVar11 + 1,__stream);
          sVar11 = strlen((char *)(pbVar10 + sVar9));
          sVar9 = sVar9 + sVar11;
          sVar11 = __size;
          __s = pbVar10;
        } while (sVar9 == __size - 1);
      }
      if (*__s == 0x23) {
        ppuVar12 = __ctype_b_loc();
        pbVar10 = __s + 7;
        pbVar20 = __s;
        do {
          pbVar22 = pbVar10;
          pbVar24 = pbVar20 + 1;
          pbVar20 = pbVar20 + 1;
          pbVar10 = pbVar22 + 1;
        } while ((*(byte *)((long)*ppuVar12 + (long)(char)*pbVar24 * 2 + 1) & 0x20) != 0);
        iVar5 = fits_strncasecmp((char *)pbVar20,"format:",7);
        if (iVar5 != 0) goto LAB_001b1db0;
        if (aRgn->nShapes == 0) {
          do {
            pbVar10 = pbVar22 + 1;
            pbVar22 = pbVar22 + 1;
          } while ((*(byte *)((long)*ppuVar12 + (long)(char)*pbVar10 * 2 + 1) & 0x20) != 0);
          iVar6 = fits_strncasecmp((char *)pbVar22,"pixel",5);
          if (iVar6 == 0) {
            iVar6 = 0;
          }
          else {
            iVar6 = fits_strncasecmp((char *)pbVar22,"degree",6);
            if (iVar6 == 0) {
              iVar6 = 1;
            }
            else {
              iVar5 = fits_strncasecmp((char *)pbVar22,"hhmmss",6);
              iVar6 = 2;
              if ((iVar5 != 0) && (iVar5 = fits_strncasecmp((char *)pbVar22,"hms",3), iVar5 != 0)) {
                pcVar8 = "Unknown format code encountered in region file.";
                goto LAB_001b1efe;
              }
            }
          }
          goto LAB_001b1db0;
        }
        pcVar8 = "Format code encountered after reading 1 or more shapes.";
LAB_001b1efe:
        iVar5 = 0x1af;
        goto LAB_001b1e78;
      }
      iVar5 = fits_strncasecmp((char *)__s,"glob",4);
      if ((iVar5 != 0) && (pbVar10 = __s, *__s != 0)) {
LAB_001b0f06:
        iVar5 = 0x1af;
        if (*status == 0) {
          uVar21 = 1;
          bVar25 = true;
          pbVar24 = (byte *)0x0;
          pbVar20 = pbVar10;
          do {
            bVar26 = *pbVar20;
            if (bVar26 < 0x23) {
              if (bVar26 != 10) {
                if (bVar26 != 0) goto switchD_001b0f40_caseD_24;
                break;
              }
switchD_001b0f40_caseD_23:
              *pbVar20 = 0;
              if (pbVar24 == (byte *)0x0) goto LAB_001b0fbc;
LAB_001b0f64:
              bVar25 = false;
            }
            else {
              switch(bVar26) {
              case 0x23:
                goto switchD_001b0f40_caseD_23;
              case 0x28:
                *pbVar20 = 0;
                if (bVar25) {
                  pbVar20 = pbVar20 + 1;
                  pbVar24 = pbVar20;
                  goto LAB_001b0f64;
                }
                goto LAB_001b1e66;
              case 0x29:
                goto switchD_001b0f40_caseD_29;
              case 0x2c:
                uVar21 = uVar21 + 1;
              case 0x24:
              case 0x25:
              case 0x26:
              case 0x27:
              case 0x2a:
              case 0x2b:
switchD_001b0f40_caseD_24:
                pbVar20 = pbVar20 + 1;
                bVar25 = pbVar24 == (byte *)0x0;
                break;
              default:
                if (bVar26 == 0x3a) {
                  iVar7 = 2;
                }
                else {
                  if (bVar26 != 100) goto switchD_001b0f40_caseD_24;
                  iVar7 = 1;
                }
                pbVar20 = pbVar20 + 1;
                bVar25 = pbVar24 == (byte *)0x0;
                if (!bVar25) {
                  iVar6 = iVar7;
                }
              }
            }
            if (*status != 0) break;
          } while( true );
        }
        goto LAB_001b1e6c;
      }
LAB_001b1db0:
      pcVar8 = fgets((char *)__s,(int)__size,__stream);
      sVar11 = __size;
    } while (pcVar8 != (char *)0x0);
  }
  fits_set_region_components(aRgn);
LAB_001b1dd4:
  if (*status == 0) {
    *local_38 = aRgn;
    goto LAB_001b1e8d;
  }
LAB_001b1e85:
  fits_free_region(aRgn);
LAB_001b1e8d:
  fclose(__stream);
  free(__s);
  return *status;
switchD_001b0f40_caseD_29:
  *pbVar20 = 0;
  if (pbVar24 == (byte *)0x0) {
LAB_001b1e66:
    *status = 1;
LAB_001b1e6c:
    pcVar8 = "Error reading Region file";
    goto LAB_001b1e78;
  }
  pbVar20 = pbVar20 + 1;
LAB_001b0fbc:
  if (*status != 0) goto LAB_001b1ef2;
  local_48 = pbVar20;
  ppuVar12 = __ctype_b_loc();
  pcVar8 = (char *)(pbVar10 + -1);
  do {
    pbVar22 = (byte *)pcVar8;
    pbVar20 = pbVar10;
    pcVar8 = (char *)(pbVar22 + 1);
    pbVar10 = pbVar20 + 1;
  } while ((*(byte *)((long)*ppuVar12 + (long)(char)pbVar22[1] * 2 + 1) & 0x20) != 0);
  if ((pbVar22[1] == 0) && (iVar5 = iVar6, pbVar24 == (byte *)0x0)) goto LAB_001b1168;
  local_80 = ppuVar12;
  iVar5 = fits_strncasecmp(pcVar8,"image;",6);
  if (iVar5 == 0) {
    pcVar8 = (char *)(pbVar22 + 7);
LAB_001b11a9:
    iVar6 = 0;
  }
  else {
    iVar5 = fits_strncasecmp(pcVar8,"physical;",9);
    if (iVar5 == 0) {
      pcVar8 = (char *)(pbVar22 + 10);
      goto LAB_001b11a9;
    }
    iVar5 = fits_strncasecmp(pcVar8,"linear;",7);
    if (iVar5 == 0) {
      pcVar8 = (char *)(pbVar22 + 8);
      goto LAB_001b11a9;
    }
    iVar5 = fits_strncasecmp(pcVar8,"fk4;",4);
    if ((iVar5 == 0) || (iVar5 = fits_strncasecmp(pcVar8,"fk5;",4), iVar5 == 0)) {
      pcVar8 = (char *)(pbVar22 + 5);
LAB_001b11b1:
      iVar6 = 1;
    }
    else {
      iVar5 = fits_strncasecmp(pcVar8,"icrs;",5);
      if (iVar5 == 0) {
        pcVar8 = (char *)(pbVar22 + 6);
        goto LAB_001b11b1;
      }
      iVar7 = fits_strncasecmp(pcVar8,"fk5",3);
      iVar5 = 1;
      if (iVar7 == 0) {
LAB_001b1168:
        bVar26 = *local_48;
        pbVar10 = local_48;
        iVar6 = iVar5;
        goto joined_r0x001b117a;
      }
      iVar5 = fits_strncasecmp(pcVar8,"fk4",3);
      if (iVar5 == 0) {
        iVar5 = 1;
        goto LAB_001b1168;
      }
      iVar7 = fits_strncasecmp(pcVar8,"icrs",4);
      iVar5 = 1;
      if (iVar7 == 0) goto LAB_001b1168;
      iVar7 = fits_strncasecmp(pcVar8,"image",5);
      iVar5 = 0;
      if (iVar7 == 0) goto LAB_001b1168;
      iVar7 = fits_strncasecmp(pcVar8,"physical",8);
      iVar5 = 0;
      if (iVar7 == 0) goto LAB_001b1168;
      iVar5 = fits_strncasecmp(pcVar8,"galactic;",9);
      if (iVar5 == 0) goto LAB_001b1f6f;
      iVar5 = fits_strncasecmp(pcVar8,"ecliptic;",9);
      if (iVar5 == 0) {
        local_60 = "ecliptic region coordinates not supported";
        pcVar8 = (char *)pbVar20;
        goto LAB_001b1f6f;
      }
    }
  }
  iVar5 = aRgn->nShapes;
  lVar17 = (long)iVar5;
  uVar16 = iVar5 * -0x33333333 + 0x19999998;
  pRVar13 = aRgn->Shapes;
  if ((uVar16 >> 1 | (uint)((uVar16 & 1) != 0) << 0x1f) < 0x19999999) {
    if (pRVar13 == (RgnShape *)0x0) {
      pRVar13 = (RgnShape *)malloc(0x690);
    }
    else {
      pRVar13 = (RgnShape *)realloc(pRVar13,lVar17 * 0xa8 + 0x690);
    }
    if (pRVar13 == (RgnShape *)0x0) {
      pcVar8 = "Failed to allocate memory for Region data";
LAB_001b1e5f:
      iVar5 = 0x71;
LAB_001b1e78:
      ffpmsg(pcVar8);
      *status = iVar5;
      goto LAB_001b1e85;
    }
    aRgn->Shapes = pRVar13;
  }
  aRgn->nShapes = iVar5 + 1;
  newShape = pRVar13 + lVar17;
  pRVar13 = pRVar13 + lVar17;
  paVar14 = &pRVar13->param;
  pRVar13->sign = '\x01';
  pRVar13->shape = point_rgn;
  (paVar14->gen).p[0] = 0.0;
  (pRVar13->param).gen.p[1] = 0.0;
  (pRVar13->param).gen.p[2] = 0.0;
  (pRVar13->param).gen.p[3] = 0.0;
  (pRVar13->param).gen.p[4] = 0.0;
  (pRVar13->param).gen.p[5] = 0.0;
  (pRVar13->param).gen.p[6] = 0.0;
  (pRVar13->param).gen.p[7] = 0.0;
  (pRVar13->param).gen.sinT = 0.0;
  (pRVar13->param).gen.cosT = 0.0;
  (pRVar13->param).gen.a = 0.0;
  (pRVar13->param).gen.b = 0.0;
  puVar3 = *local_80;
  do {
    pbVar10 = (byte *)pcVar8;
    bVar26 = *pbVar10;
    pcVar8 = (char *)(pbVar10 + 1);
  } while ((*(byte *)((long)puVar3 + (long)(char)bVar26 * 2 + 1) & 0x20) != 0);
  pbVar20 = (byte *)pcVar8;
  if ((bVar26 != 0x2b) && (pbVar20 = pbVar10, bVar26 == 0x2d)) {
    newShape->sign = '\0';
    pbVar20 = (byte *)pcVar8;
  }
  pbVar10 = pbVar20 + -1;
  do {
    pcVar8 = (char *)pbVar20;
    pbVar22 = pbVar10;
    pbVar10 = pbVar22 + 1;
    pbVar20 = (byte *)pcVar8 + 1;
  } while ((*(byte *)((long)puVar3 + (long)*pcVar8 * 2 + 1) & 0x20) != 0);
  if (*pcVar8 == 0) {
LAB_001b1ef2:
    pcVar8 = "Error reading Region file";
    goto LAB_001b1efe;
  }
  sVar11 = strlen(pcVar8);
  if ((*(byte *)((long)puVar3 + (long)(char)((byte *)pcVar8)[sVar11 - 1] * 2 + 1) & 0x20) != 0) {
    pbVar22 = pbVar22 + sVar11;
    do {
      *pbVar22 = 0;
      pbVar10 = pbVar22 + -1;
      pbVar22 = pbVar22 + -1;
    } while ((*(byte *)((long)*local_80 + (long)(char)*pbVar10 * 2 + 1) & 0x20) != 0);
  }
  iVar5 = fits_strcasecmp(pcVar8,"circle");
  if (iVar5 == 0) {
    newShape->shape = circle_rgn;
    local_d4 = 2;
    if (uVar21 != 3) {
LAB_001b1f09:
      *status = 0x1af;
      goto LAB_001b1f0f;
    }
  }
  else {
    iVar5 = fits_strcasecmp(pcVar8,"annulus");
    if (iVar5 == 0) {
      newShape->shape = annulus_rgn;
      local_d4 = 2;
      if (uVar21 != 4) goto LAB_001b1f09;
    }
    else {
      iVar5 = fits_strcasecmp(pcVar8,"ellipse");
      if (iVar5 == 0) {
        if (uVar21 - 9 < 0xfffffffb) goto LAB_001b1f09;
        if (5 < uVar21) {
          newShape->shape = elliptannulus_rgn;
          goto LAB_001b15b6;
        }
        newShape->shape = ellipse_rgn;
LAB_001b157f:
        (newShape->param).gen.p[4] = 0.0;
      }
      else {
        iVar5 = fits_strcasecmp(pcVar8,"elliptannulus");
        if (iVar5 == 0) {
          newShape->shape = elliptannulus_rgn;
          if ((uVar21 != 6) && (uVar21 != 8)) {
            *status = 0x1af;
          }
        }
        else {
          iVar5 = fits_strcasecmp(pcVar8,"box");
          if ((iVar5 != 0) && (iVar5 = fits_strcasecmp(pcVar8,"rotbox"), iVar5 != 0)) {
            iVar5 = fits_strcasecmp(pcVar8,"rectangle");
            if ((iVar5 == 0) || (iVar5 = fits_strcasecmp(pcVar8,"rotrectangle"), iVar5 == 0)) {
              newShape->shape = rectangle_rgn;
              if (uVar21 - 6 < 0xfffffffe) {
                *status = 0x1af;
              }
              (newShape->param).gen.p[4] = 0.0;
              local_d4 = 4;
            }
            else {
              iVar5 = fits_strcasecmp(pcVar8,"diamond");
              if ((((iVar5 == 0) || (iVar5 = fits_strcasecmp(pcVar8,"rotdiamond"), iVar5 == 0)) ||
                  (iVar5 = fits_strcasecmp(pcVar8,"rhombus"), iVar5 == 0)) ||
                 (iVar5 = fits_strcasecmp(pcVar8,"rotrhombus"), iVar5 == 0)) {
                newShape->shape = diamond_rgn;
                if (uVar21 - 6 < 0xfffffffe) {
                  *status = 0x1af;
                }
                (newShape->param).gen.p[4] = 0.0;
LAB_001b1c95:
                local_d4 = 2;
              }
              else {
                iVar5 = fits_strcasecmp(pcVar8,"sector");
                if ((iVar5 == 0) || (iVar5 = fits_strcasecmp(pcVar8,"pie"), iVar5 == 0)) {
                  newShape->shape = sector_rgn;
                  local_d4 = 2;
LAB_001b1cbb:
                  bVar25 = uVar21 == 4;
                }
                else {
                  iVar5 = fits_strcasecmp(pcVar8,"point");
                  if (iVar5 == 0) {
                    newShape->shape = point_rgn;
                    local_d4 = 2;
                    bVar25 = uVar21 == 2;
                  }
                  else {
                    iVar5 = fits_strcasecmp(pcVar8,"line");
                    if (iVar5 == 0) {
                      newShape->shape = line_rgn;
                      local_d4 = 4;
                      goto LAB_001b1cbb;
                    }
                    iVar5 = fits_strcasecmp(pcVar8,"polygon");
                    if (iVar5 == 0) {
                      newShape->shape = poly_rgn;
                      if (((int)uVar21 < 6) || (local_d4 = uVar21, (uVar21 & 1) != 0))
                      goto LAB_001b1f09;
                      goto LAB_001b15c7;
                    }
                    iVar5 = fits_strcasecmp(pcVar8,"panda");
                    if (iVar5 != 0) {
                      iVar5 = fits_strcasecmp(pcVar8,"epanda");
                      if (iVar5 == 0) {
                        newShape->shape = epanda_rgn;
                      }
                      else {
                        iVar5 = fits_strcasecmp(pcVar8,"bpanda");
                        if (iVar5 != 0) {
                          local_60 = "Unrecognized region found in region file:";
LAB_001b1f6f:
                          ffpmsg(local_60);
                          goto LAB_001b1efe;
                        }
                        newShape->shape = bpanda_rgn;
                      }
                      if (uVar21 - 0xc < 0xfffffffe) {
                        *status = 0x1af;
                      }
                      (newShape->param).gen.p[10] = 0.0;
                      goto LAB_001b1c95;
                    }
                    newShape->shape = panda_rgn;
                    local_d4 = 2;
                    bVar25 = uVar21 == 8;
                  }
                }
                if (!bVar25) goto LAB_001b1f09;
              }
            }
            goto LAB_001b15c7;
          }
          if (uVar21 - 9 < 0xfffffffb) goto LAB_001b1f09;
          if (uVar21 < 6) {
            newShape->shape = box_rgn;
            goto LAB_001b157f;
          }
          newShape->shape = boxannulus_rgn;
        }
LAB_001b15b6:
        (newShape->param).gen.p[6] = 0.0;
        (newShape->param).gen.p[7] = 0.0;
      }
      local_d4 = 2;
    }
  }
LAB_001b15c7:
  if (*status != 0) {
LAB_001b1f0f:
    ffpmsg("Wrong number of parameters found for region");
    ffpmsg(pcVar8);
    goto LAB_001b1dd4;
  }
  local_98 = paVar14;
  if (newShape->shape == poly_rgn) {
    local_98 = (anon_union_120_2_131c4ffb_for_param *)malloc((long)(int)uVar21 << 3);
    (newShape->param).poly.Pts = (double *)local_98;
    if (local_98 == (anon_union_120_2_131c4ffb_for_param *)0x0) {
      pcVar8 = "Could not allocate memory to hold polygon parameters";
      goto LAB_001b1e5f;
    }
    (paVar14->poly).nPts = uVar21;
  }
  local_d0 = 0;
  do {
    pbVar10 = pbVar24 + 2;
    pbVar20 = pbVar24;
    do {
      pbVar23 = pbVar20;
      pbVar22 = pbVar10;
      pbVar10 = pbVar22 + 1;
      pbVar20 = pbVar23 + 1;
    } while (*pbVar23 != 0x2c);
    *pbVar23 = 0;
    for (; (pbVar22[-1] != 0 && (pbVar22[-1] != 0x2c)); pbVar22 = pbVar22 + 1) {
    }
    pbVar22[-1] = 0;
    pcVar8 = strchr((char *)pbVar24,0x3a);
    if (pcVar8 == (char *)0x0) {
      local_a0 = atof((char *)pbVar24);
      ypos = atof((char *)(pbVar23 + 1));
      dVar27 = local_a0;
      dVar28 = ypos;
      if (local_d0 != 0) {
        dVar27 = local_78;
        dVar28 = local_70;
      }
      if (iVar6 != 0) goto LAB_001b1881;
      iVar6 = 0;
      local_78 = dVar27;
      local_70 = dVar28;
    }
    else {
      lVar17 = strtol((char *)pbVar24,&local_88,10);
      dVar27 = 0.0;
      if ((local_88 == (char *)0x0) || (*local_88 != ':')) {
        lVar15 = 0;
      }
      else {
        lVar15 = strtol(local_88 + 1,&local_88,10);
        if (local_88 == (char *)0x0) {
          dVar27 = 0.0;
        }
        else {
          dVar27 = 0.0;
          if (*local_88 == ':') {
            dVar27 = atof(local_88 + 1);
          }
        }
      }
      do {
        bVar26 = pbVar23[1];
        pbVar23 = pbVar23 + 1;
      } while ((*(byte *)((long)*local_80 + (long)(char)bVar26 * 2 + 1) & 0x20) != 0);
      local_a0 = (dVar27 / 3600.0 + (double)lVar15 / 60.0 + (double)lVar17) * 15.0;
      lVar17 = strtol((char *)(pbVar23 + (bVar26 == 0x2d)),&local_88,10);
      dVar27 = 0.0;
      if ((local_88 == (char *)0x0) || (*local_88 != ':')) {
        lVar15 = 0;
      }
      else {
        lVar15 = strtol(local_88 + 1,&local_88,10);
        if (local_88 == (char *)0x0) {
          dVar27 = 0.0;
        }
        else {
          dVar27 = 0.0;
          if (*local_88 == ':') {
            dVar27 = atof(local_88 + 1);
          }
        }
      }
      if (bVar26 == 0x2d) {
        auVar29._0_8_ = (double)lVar15;
        auVar29._8_8_ = dVar27;
        auVar30 = divpd(auVar29,_DAT_001d6440);
        ypos = ((double)-lVar17 - auVar30._0_8_) - auVar30._8_8_;
      }
      else {
        auVar30._8_8_ = (double)lVar15;
        auVar30._0_8_ = dVar27;
        auVar30 = divpd(auVar30,_DAT_001d6430);
        ypos = auVar30._8_8_ + (double)lVar17 + auVar30._0_8_;
      }
      dVar27 = local_a0;
      dVar28 = ypos;
      if (local_d0 != 0) {
        dVar27 = local_78;
        dVar28 = local_70;
      }
      iVar6 = 2;
LAB_001b1881:
      local_78 = dVar27;
      local_70 = dVar28;
      if ((local_68 == (WCSdata *)0x0) || (local_68->exists == 0)) {
        pcVar8 = "WCS information needed to convert region coordinates.";
        iVar5 = 0x1f9;
        goto LAB_001b1e78;
      }
      iVar5 = ffxypx(local_a0,ypos,local_68->xrefval,local_68->yrefval,local_68->xrefpix,
                     local_68->yrefpix,local_68->xinc,local_68->yinc,local_68->rot,local_40,
                     &local_50,&local_58,status);
      local_a0 = local_50;
      ypos = local_58;
      if (iVar5 != 0) goto LAB_001b1ece;
    }
    pbVar10 = local_48;
    *(double *)((long)local_98 + local_d0 * 8) = local_a0;
    *(double *)((long)local_98 + local_d0 * 8 + 8) = ypos;
    local_d0 = local_d0 + 2;
    pbVar24 = pbVar22;
  } while ((int)local_d0 < (int)local_d4);
  if ((int)local_d0 < (int)uVar21) {
    local_d0 = local_d0 & 0xffffffff;
    pbVar20 = pbVar22;
LAB_001b198f:
    do {
      pbVar24 = pbVar22;
      pbVar22 = pbVar24 + 1;
      if (*pbVar24 != 0) {
        if (*pbVar24 != 0x2c) goto LAB_001b198f;
      }
      *pbVar24 = 0;
      dVar27 = strtod((char *)pbVar20,&local_88);
      *(double *)((long)local_98 + local_d0 * 8) = dVar27;
      if ((local_88 != (char *)0x0) &&
         (((cVar1 = *local_88, cVar1 == '\"' || (cVar1 == 'd')) || (cVar1 == '\'')))) {
        dVar28 = 60.0;
        if (cVar1 != '\'') {
          dVar28 = *(double *)(&DAT_001d6450 + (ulong)(cVar1 == '\"') * 8);
        }
        iVar5 = ffxypx(local_78,(double)(~-(ulong)(local_70 < 0.0) & (ulong)-dVar27 |
                                        -(ulong)(local_70 < 0.0) & (ulong)dVar27) / dVar28 +
                                local_70,local_68->xrefval,local_68->yrefval,local_68->xrefpix,
                       local_68->yrefpix,local_68->xinc,local_68->yinc,local_68->rot,local_40,
                       &local_50,&local_58,status);
        if (iVar5 != 0) goto LAB_001b1ece;
        dVar27 = local_50 - (local_98->gen).p[0];
        dVar28 = local_58 - (local_98->gen).p[1];
        *(double *)((long)local_98 + local_d0 * 8) = SQRT(dVar28 * dVar28 + dVar27 * dVar27);
      }
      local_d0 = local_d0 + 1;
      pbVar20 = pbVar22;
    } while ((int)local_d0 < (int)uVar21);
  }
  sVar2 = newShape->shape;
  if (sVar2 == elliptannulus_rgn) {
    bVar25 = uVar21 == 7;
  }
  else {
    bVar25 = uVar21 == 7 && sVar2 == boxannulus_rgn;
  }
  if (bVar25) {
    (local_98->gen).p[7] = (local_98->gen).p[6];
  }
  if (iVar6 != 0) {
    switch(sVar2) {
    case ellipse_rgn:
    case box_rgn:
    case rectangle_rgn:
    case diamond_rgn:
      lVar17 = 0x20;
      goto LAB_001b1bec;
    case elliptannulus_rgn:
    case boxannulus_rgn:
      lVar17 = 0x38;
      lVar15 = 0x30;
      break;
    case sector_rgn:
    case panda_rgn:
      lVar17 = 0x18;
      lVar15 = 0x10;
      break;
    default:
      goto switchD_001b1b48_caseD_b;
    case epanda_rgn:
    case bpanda_rgn:
      (local_98->gen).p[2] = local_68->rot + (local_98->gen).p[2];
      lVar17 = 0x50;
      lVar15 = 0x18;
    }
    *(double *)((long)local_98 + lVar15) = local_68->rot + *(double *)((long)local_98 + lVar15);
LAB_001b1bec:
    *(double *)((long)local_98 + lVar17) = local_68->rot + *(double *)((long)local_98 + lVar17);
  }
switchD_001b1b48_caseD_b:
  fits_setup_shape(newShape);
  bVar26 = *pbVar10;
joined_r0x001b117a:
  if (bVar26 == 0) goto LAB_001b1db0;
  goto LAB_001b0f06;
LAB_001b1ece:
  ffpmsg("Error converting region to pixel coordinates.");
  goto LAB_001b1dd4;
}

Assistant:

int fits_read_ascii_region( const char *filename,
			    WCSdata    *wcs,
			    SAORegion  **Rgn,
			    int        *status )
/*  Read regions from a SAO-style region file and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{
   char     *currLine;
   char     *namePtr, *paramPtr, *currLoc;
   char     *pX, *pY, *endp;
   long     allocLen, lineLen, hh, mm, dd;
   double   *coords, X, Y, x, y, ss, div, xsave= 0., ysave= 0.;
   int      nParams, nCoords, negdec;
   int      i, done;
   FILE     *rgnFile;
   coordFmt cFmt;
   SAORegion *aRgn;
   RgnShape *newShape, *tmpShape;

   if( *status ) return( *status );

   aRgn = (SAORegion *)malloc( sizeof(SAORegion) );
   if( ! aRgn ) {
      ffpmsg("Couldn't allocate memory to hold Region file contents.");
      return(*status = MEMORY_ALLOCATION );
   }
   aRgn->nShapes    =    0;
   aRgn->Shapes     = NULL;
   if( wcs && wcs->exists )
      aRgn->wcs = *wcs;
   else
      aRgn->wcs.exists = 0;

   cFmt = pixel_fmt; /* set default format */

   /*  Allocate Line Buffer  */

   allocLen = 512;
   currLine = (char *)malloc( allocLen * sizeof(char) );
   if( !currLine ) {
      free( aRgn );
      ffpmsg("Couldn't allocate memory to hold Region file contents.");
      return(*status = MEMORY_ALLOCATION );
   }

   /*  Open Region File  */

   if( (rgnFile = fopen( filename, "r" ))==NULL ) {
      snprintf(currLine,allocLen,"Could not open Region file %s.",filename);
      ffpmsg( currLine );
      free( currLine );
      free( aRgn );
      return( *status = FILE_NOT_OPENED );
   }
   
   /*  Read in file, line by line  */
   /*  First, set error status in case file is empty */ 
   *status = FILE_NOT_OPENED;

   while( fgets(currLine,allocLen,rgnFile) != NULL ) {

      /* reset status if we got here */
      *status = 0;

      /*  Make sure we have a full line of text  */

      lineLen = strlen(currLine);
      while( lineLen==allocLen-1 && currLine[lineLen-1]!='\n' ) {
         currLoc = (char *)realloc( currLine, 2 * allocLen * sizeof(char) );
         if( !currLoc ) {
            ffpmsg("Couldn't allocate memory to hold Region file contents.");
            *status = MEMORY_ALLOCATION;
            goto error;
         } else {
            currLine = currLoc;
         }
         fgets( currLine+lineLen, allocLen+1, rgnFile );
         allocLen += allocLen;
         lineLen  += strlen(currLine+lineLen);
      }

      currLoc = currLine;
      if( *currLoc == '#' ) {

         /*  Look to see if it is followed by a format statement...  */
         /*  if not skip line                                        */

         currLoc++;
         while( isspace(*currLoc) ) currLoc++;
         if( !fits_strncasecmp( currLoc, "format:", 7 ) ) {
            if( aRgn->nShapes ) {
               ffpmsg("Format code encountered after reading 1 or more shapes.");
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            currLoc += 7;
            while( isspace(*currLoc) ) currLoc++;
            if( !fits_strncasecmp( currLoc, "pixel", 5 ) ) {
               cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( currLoc, "degree", 6 ) ) {
               cFmt = degree_fmt;
            } else if( !fits_strncasecmp( currLoc, "hhmmss", 6 ) ) {
               cFmt = hhmmss_fmt;
            } else if( !fits_strncasecmp( currLoc, "hms", 3 ) ) {
               cFmt = hhmmss_fmt;
            } else {
               ffpmsg("Unknown format code encountered in region file.");
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
         }

      } else if( !fits_strncasecmp( currLoc, "glob", 4 ) ) {
		  /* skip lines that begin with the word 'global' */

      } else {

         while( *currLoc != '\0' ) {

            namePtr  = currLoc;
            paramPtr = NULL;
            nParams  = 1;

            /*  Search for closing parenthesis  */

            done = 0;
            while( !done && !*status && *currLoc ) {
               switch (*currLoc) {
               case '(':
                  *currLoc = '\0';
                  currLoc++;
                  if( paramPtr )   /* Can't have two '(' in a region! */
                     *status = 1;
                  else
                     paramPtr = currLoc;
                  break;
               case ')':
                  *currLoc = '\0';
                  currLoc++;
                  if( !paramPtr )  /* Can't have a ')' without a '(' first */
                     *status = 1;
                  else
                     done = 1;
                  break;
               case '#':
               case '\n':
                  *currLoc = '\0';
                  if( !paramPtr )  /* Allow for a blank line */
                     done = 1;
                  break;
               case ':':  
                  currLoc++;
                  if ( paramPtr ) cFmt = hhmmss_fmt; /* set format if parameter has : */
                  break;
               case 'd':
                  currLoc++;
                  if ( paramPtr ) cFmt = degree_fmt; /* set format if parameter has d */  
                  break;
               case ',':
                  nParams++;  /* Fall through to default */
               default:
                  currLoc++;
                  break;
               }
            }
            if( *status || !done ) {
               ffpmsg( "Error reading Region file" );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }

            /*  Skip white space in region name  */

            while( isspace(*namePtr) ) namePtr++;

            /*  Was this a blank line? Or the end of the current one  */

            if( ! *namePtr && ! paramPtr ) continue;

            /*  Check for format code at beginning of the line */

            if( !fits_strncasecmp( namePtr, "image;", 6 ) ) {
				namePtr += 6;
				cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "physical;", 9 ) ) {
                                namePtr += 9;
                                cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "linear;", 7 ) ) {
                                namePtr += 7;
                                cFmt = pixel_fmt;
            } else if( !fits_strncasecmp( namePtr, "fk4;", 4 ) ) {
				namePtr += 4;
				cFmt = degree_fmt;
            } else if( !fits_strncasecmp( namePtr, "fk5;", 4 ) ) {
				namePtr += 4;
				cFmt = degree_fmt;
            } else if( !fits_strncasecmp( namePtr, "icrs;", 5 ) ) {
				namePtr += 5;
				cFmt = degree_fmt;

            /* the following 5 cases support region files created by POW 
	       (or ds9 Version 4.x) which
               may have lines containing  only a format code, not followed
               by a ';' (and with no region specifier on the line).  We use
               the 'continue' statement to jump to the end of the loop and
               then continue reading the next line of the region file. */

            } else if( !fits_strncasecmp( namePtr, "fk5", 3 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "fk4", 3 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "icrs", 4 ) ) {
				cFmt = degree_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "image", 5 ) ) {
				cFmt = pixel_fmt;
                                continue;  /* supports POW region file format */
            } else if( !fits_strncasecmp( namePtr, "physical", 8 ) ) {
				cFmt = pixel_fmt;
                                continue;  /* supports POW region file format */


            } else if( !fits_strncasecmp( namePtr, "galactic;", 9 ) ) {
               ffpmsg( "Galactic region coordinates not supported" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            } else if( !fits_strncasecmp( namePtr, "ecliptic;", 9 ) ) {
               ffpmsg( "ecliptic region coordinates not supported" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }

            /**************************************************/
            /*  We've apparently found a region... Set it up  */
            /**************************************************/

            if( !(aRgn->nShapes % 10) ) {
               if( aRgn->Shapes )
                  tmpShape = (RgnShape *)realloc( aRgn->Shapes,
                                                  (10+aRgn->nShapes)
                                                  * sizeof(RgnShape) );
               else
                  tmpShape = (RgnShape *) malloc( 10 * sizeof(RgnShape) );
               if( tmpShape ) {
                  aRgn->Shapes = tmpShape;
               } else {
                  ffpmsg( "Failed to allocate memory for Region data");
                  *status = MEMORY_ALLOCATION;
                  goto error;
               }

            }
            newShape        = &aRgn->Shapes[aRgn->nShapes++];
            newShape->sign  = 1;
            newShape->shape = point_rgn;
	    for (i=0; i<8; i++) newShape->param.gen.p[i] = 0.0;
	    newShape->param.gen.a = 0.0;
	    newShape->param.gen.b = 0.0;
	    newShape->param.gen.sinT = 0.0;
	    newShape->param.gen.cosT = 0.0;

            while( isspace(*namePtr) ) namePtr++;
            
			/*  Check for the shape's sign  */

            if( *namePtr=='+' ) {
               namePtr++;
            } else if( *namePtr=='-' ) {
               namePtr++;
               newShape->sign = 0;
            }

            /* Skip white space in region name */

            while( isspace(*namePtr) ) namePtr++;
            if( *namePtr=='\0' ) {
               ffpmsg( "Error reading Region file" );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            lineLen = strlen( namePtr ) - 1;
            while( isspace(namePtr[lineLen]) ) namePtr[lineLen--] = '\0';

            /*  Now identify the region  */

            if(        !fits_strcasecmp( namePtr, "circle"  ) ) {
               newShape->shape = circle_rgn;
               if( nParams != 3 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "annulus" ) ) {
               newShape->shape = annulus_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "ellipse" ) ) {
               if( nParams < 4 || nParams > 8 ) {
                  *status = PARSE_SYNTAX_ERR;
	       } else if ( nParams < 6 ) {
		 newShape->shape = ellipse_rgn;
		 newShape->param.gen.p[4] = 0.0;
	       } else {
		 newShape->shape = elliptannulus_rgn;
		 newShape->param.gen.p[6] = 0.0;
		 newShape->param.gen.p[7] = 0.0;
	       }
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "elliptannulus" ) ) {
               newShape->shape = elliptannulus_rgn;
               if( !( nParams==8 || nParams==6 ) )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[6] = 0.0;
               newShape->param.gen.p[7] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "box"    ) 
                    || !fits_strcasecmp( namePtr, "rotbox" ) ) {
	       if( nParams < 4 || nParams > 8 ) {
		 *status = PARSE_SYNTAX_ERR;
	       } else if ( nParams < 6 ) {
		 newShape->shape = box_rgn;
		 newShape->param.gen.p[4] = 0.0;
	       } else {
		  newShape->shape = boxannulus_rgn;
		  newShape->param.gen.p[6] = 0.0;
		  newShape->param.gen.p[7] = 0.0;
	       }
	       nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "rectangle"    )
                    || !fits_strcasecmp( namePtr, "rotrectangle" ) ) {
               newShape->shape = rectangle_rgn;
               if( nParams < 4 || nParams > 5 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[4] = 0.0;
               nCoords = 4;
            } else if( !fits_strcasecmp( namePtr, "diamond"    )
                    || !fits_strcasecmp( namePtr, "rotdiamond" )
                    || !fits_strcasecmp( namePtr, "rhombus"    )
                    || !fits_strcasecmp( namePtr, "rotrhombus" ) ) {
               newShape->shape = diamond_rgn;
               if( nParams < 4 || nParams > 5 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[4] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "sector"  )
                    || !fits_strcasecmp( namePtr, "pie"     ) ) {
               newShape->shape = sector_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "point"   ) ) {
               newShape->shape = point_rgn;
               if( nParams != 2 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "line"    ) ) {
               newShape->shape = line_rgn;
               if( nParams != 4 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 4;
            } else if( !fits_strcasecmp( namePtr, "polygon" ) ) {
               newShape->shape = poly_rgn;
               if( nParams < 6 || (nParams&1) )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = nParams;
            } else if( !fits_strcasecmp( namePtr, "panda" ) ) {
               newShape->shape = panda_rgn;
               if( nParams != 8 )
                  *status = PARSE_SYNTAX_ERR;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "epanda" ) ) {
               newShape->shape = epanda_rgn;
               if( nParams < 10 || nParams > 11 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[10] = 0.0;
               nCoords = 2;
            } else if( !fits_strcasecmp( namePtr, "bpanda" ) ) {
               newShape->shape = bpanda_rgn;
               if( nParams < 10 || nParams > 11 )
                  *status = PARSE_SYNTAX_ERR;
               newShape->param.gen.p[10] = 0.0;
               nCoords = 2;
            } else {
               ffpmsg( "Unrecognized region found in region file:" );
               ffpmsg( namePtr );
               *status = PARSE_SYNTAX_ERR;
               goto error;
            }
            if( *status ) {
               ffpmsg( "Wrong number of parameters found for region" );
               ffpmsg( namePtr );
               goto error;
            }

            /*  Parse Parameter string... convert to pixels if necessary  */

            if( newShape->shape==poly_rgn ) {
               newShape->param.poly.Pts = (double *)malloc( nParams
                                                            * sizeof(double) );
               if( !newShape->param.poly.Pts ) {
                  ffpmsg(
                      "Could not allocate memory to hold polygon parameters" );
                  *status = MEMORY_ALLOCATION;
                  goto error;
               }
               newShape->param.poly.nPts = nParams;
               coords = newShape->param.poly.Pts;
            } else
               coords = newShape->param.gen.p;

            /*  Parse the initial "WCS?" coordinates  */
            for( i=0; i<nCoords; i+=2 ) {

               pX = paramPtr;
               while( *paramPtr!=',' ) paramPtr++;
               *(paramPtr++) = '\0';

               pY = paramPtr;
               while( *paramPtr!=',' && *paramPtr != '\0' ) paramPtr++;
               *(paramPtr++) = '\0';

               if( strchr(pX, ':' ) ) {
                  /*  Read in special format & convert to decimal degrees  */
                  cFmt = hhmmss_fmt;
                  mm = 0;
                  ss = 0.;
                  hh = strtol(pX, &endp, 10);
                  if (endp && *endp==':') {
                      pX = endp + 1;
                      mm = strtol(pX, &endp, 10);
                      if (endp && *endp==':') {
                          pX = endp + 1;
                          ss = atof( pX );
                      }
                  }
                  X = 15. * (hh + mm/60. + ss/3600.); /* convert to degrees */

                  mm = 0;
                  ss = 0.;
                  negdec = 0;

                  while( isspace(*pY) ) pY++;
                  if (*pY=='-') {
                      negdec = 1;
                      pY++;
                  }
                  dd = strtol(pY, &endp, 10);
                  if (endp && *endp==':') {
                      pY = endp + 1;
                      mm = strtol(pY, &endp, 10);
                      if (endp && *endp==':') {
                          pY = endp + 1;
                          ss = atof( pY );
                      }
                  }
                  if (negdec)
                     Y = -dd - mm/60. - ss/3600.; /* convert to degrees */
                  else
                     Y = dd + mm/60. + ss/3600.;

               } else {
                  X = atof( pX );
                  Y = atof( pY );
               }
               if (i==0) {   /* save 1st coord. in case needed later */
                   xsave = X;
                   ysave = Y;
               }

               if( cFmt!=pixel_fmt ) {
                  /*  Convert to pixels  */
                  if( wcs==NULL || ! wcs->exists ) {
                     ffpmsg("WCS information needed to convert region coordinates.");
                     *status = NO_WCS_KEY;
                     goto error;
                  }
                  
                  if( ffxypx(  X,  Y, wcs->xrefval, wcs->yrefval,
                                      wcs->xrefpix, wcs->yrefpix,
                                      wcs->xinc,    wcs->yinc,
                                      wcs->rot,     wcs->type,
                              &x, &y, status ) ) {
                     ffpmsg("Error converting region to pixel coordinates.");
                     goto error;
                  }
                  X = x; Y = y;
               }
               coords[i]   = X;
               coords[i+1] = Y;

            }

            /*  Read in remaining parameters...  */

            for( ; i<nParams; i++ ) {
               pX = paramPtr;
               while( *paramPtr!=',' && *paramPtr != '\0' ) paramPtr++;
               *(paramPtr++) = '\0';
               coords[i] = strtod( pX, &endp );

	       if (endp && (*endp=='"' || *endp=='\'' || *endp=='d') ) {
		  div = 1.0;
		  if ( *endp=='"' ) div = 3600.0;
		  if ( *endp=='\'' ) div = 60.0;
		  /* parameter given in arcsec so convert to pixels. */
		  /* Increment first Y coordinate by this amount then calc */
		  /* the distance in pixels from the original coordinate. */
		  /* NOTE: This assumes the pixels are square!! */
		  if (ysave < 0.)
		     Y = ysave + coords[i]/div;  /* don't exceed -90 */
		  else
		     Y = ysave - coords[i]/div;  /* don't exceed +90 */

		  X = xsave;
		  if( ffxypx(  X,  Y, wcs->xrefval, wcs->yrefval,
			       wcs->xrefpix, wcs->yrefpix,
			       wcs->xinc,    wcs->yinc,
			       wcs->rot,     wcs->type,
                               &x, &y, status ) ) {
		     ffpmsg("Error converting region to pixel coordinates.");
		     goto error;
		  }
		 
		  coords[i] = sqrt( pow(x-coords[0],2) + pow(y-coords[1],2) );

               }
            }

	    /* special case for elliptannulus and boxannulus if only one angle
	       was given */

	    if ( (newShape->shape == elliptannulus_rgn || 
		  newShape->shape == boxannulus_rgn ) && nParams == 7 ) {
	      coords[7] = coords[6];
	    }

            /* Also, correct the position angle for any WCS rotation:  */
            /*    If regions are specified in WCS coordintes, then the angles */
            /*    are relative to the WCS system, not the pixel X,Y system */

	    if( cFmt!=pixel_fmt ) {	    
	      switch( newShape->shape ) {
	      case sector_rgn:
	      case panda_rgn:
		coords[2] += (wcs->rot);
		coords[3] += (wcs->rot);
		break;
	      case box_rgn:
	      case rectangle_rgn:
	      case diamond_rgn:
	      case ellipse_rgn:
		coords[4] += (wcs->rot);
		break;
	      case boxannulus_rgn:
	      case elliptannulus_rgn:
		coords[6] += (wcs->rot);
		coords[7] += (wcs->rot);
		break;
	      case epanda_rgn:
	      case bpanda_rgn:
		coords[2] += (wcs->rot);
		coords[3] += (wcs->rot);
		coords[10] += (wcs->rot);
              default:
                break;
	      }
	    }

	    /* do some precalculations to speed up tests */

	    fits_setup_shape(newShape);

         }  /* End of while( *currLoc ) */
/*
  if (coords)printf("%.8f %.8f %.8f %.8f %.8f\n",
   coords[0],coords[1],coords[2],coords[3],coords[4]); 
*/
      }  /* End of if...else parse line */
   }   /* End of while( fgets(rgnFile) ) */

   /* set up component numbers */

   fits_set_region_components( aRgn );

error:

   if( *status ) {
      fits_free_region( aRgn );
   } else {
      *Rgn = aRgn;
   }

   fclose( rgnFile );
   free( currLine );

   return( *status );
}